

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  char *__s;
  bool bVar4;
  ImGuiContext *pIVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  
  do {
    pIVar5 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pcVar8 = GImGui->LogNextPrefix;
    __s = GImGui->LogNextSuffix;
    GImGui->LogNextPrefix = (char *)0x0;
    pIVar5->LogNextSuffix = (char *)0x0;
    if ((text_end == (char *)0x0) && (text_end = text, text != (char *)0xffffffffffffffff)) {
      do {
        if (*text_end == '#') {
          if (text_end[1] == '#') goto LAB_0012b409;
        }
        else if (*text_end == '\0') goto LAB_0012b409;
        text_end = text_end + 1;
      } while (text_end != (char *)0xffffffffffffffff);
      text_end = (char *)0xffffffffffffffff;
    }
LAB_0012b409:
    if (ref_pos == (ImVec2 *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = pIVar5->LogLinePosY + (pIVar5->Style).FramePadding.y + 1.0 < ref_pos->y;
      pIVar5->LogLinePosY = ref_pos->y;
    }
    if (bVar4) {
      LogText("\n");
      pIVar5->LogLineFirstItem = true;
    }
    if (pcVar8 != (char *)0x0) {
      sVar6 = strlen(pcVar8);
      LogRenderedText(ref_pos,pcVar8,pcVar8 + sVar6);
    }
    iVar1 = (pIVar3->DC).TreeDepth;
    if (iVar1 < pIVar5->LogDepthRef) {
      pIVar5->LogDepthRef = iVar1;
    }
    iVar2 = pIVar5->LogDepthRef;
    do {
      pcVar7 = (char *)memchr(text,10,(long)text_end - (long)text);
      pcVar8 = text_end;
      if (pcVar7 != (char *)0x0) {
        pcVar8 = pcVar7;
      }
      if ((text != pcVar8) || (pcVar8 != text_end)) {
        uVar9 = (ulong)(uint)((iVar1 - iVar2) * 4);
        if (pIVar5->LogLineFirstItem == false) {
          uVar9 = 1;
        }
        LogText("%*s%.*s",uVar9,"",(ulong)(uint)((int)pcVar8 - (int)text),text);
        pIVar5->LogLineFirstItem = false;
        if (*pcVar8 == '\n') {
          LogText("\n");
          pIVar5->LogLineFirstItem = true;
        }
      }
      text = pcVar8 + 1;
    } while (pcVar8 != text_end);
    if (__s == (char *)0x0) {
      return;
    }
    sVar6 = strlen(__s);
    text_end = __s + sVar6;
    text = __s;
  } while( true );
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const char* prefix = g.LogNextPrefix;
    const char* suffix = g.LogNextSuffix;
    g.LogNextPrefix = g.LogNextSuffix = NULL;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > g.LogLinePosY + g.Style.FramePadding.y + 1);
    if (ref_pos)
        g.LogLinePosY = ref_pos->y;
    if (log_new_line)
    {
        LogText(IM_NEWLINE);
        g.LogLineFirstItem = true;
    }

    if (prefix)
        LogRenderedText(ref_pos, prefix, prefix + strlen(prefix)); // Calculate end ourself to ensure "##" are included here.

    // Re-adjust padding if we have popped out of our starting depth
    if (g.LogDepthRef > window->DC.TreeDepth)
        g.LogDepthRef = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogDepthRef);

    const char* text_remaining = text;
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by indentation corresponding to the current depth of our log entry.
        // We don't add a trailing \n yet to allow a subsequent item on the same line to be captured.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_last_line = (line_end == text_end);
        if (line_start != line_end || !is_last_line)
        {
            const int line_length = (int)(line_end - line_start);
            const int indentation = g.LogLineFirstItem ? tree_depth * 4 : 1;
            LogText("%*s%.*s", indentation, "", line_length, line_start);
            g.LogLineFirstItem = false;
            if (*line_end == '\n')
            {
                LogText(IM_NEWLINE);
                g.LogLineFirstItem = true;
            }
        }
        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }

    if (suffix)
        LogRenderedText(ref_pos, suffix, suffix + strlen(suffix));
}